

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash,uchar *key,size_t keylen)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uchar rkey [64];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_48 = *(undefined8 *)(key + 0x10);
  uStack_40 = *(undefined8 *)(key + 0x18);
  local_58 = *(undefined8 *)key;
  uStack_50 = *(undefined8 *)(key + 8);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  (hash->outer).s[0] = 0x6a09e667;
  (hash->outer).s[1] = 0xbb67ae85;
  (hash->outer).s[2] = 0x3c6ef372;
  (hash->outer).s[3] = 0xa54ff53a;
  (hash->outer).s[4] = 0x510e527f;
  (hash->outer).s[5] = 0x9b05688c;
  (hash->outer).s[6] = 0x1f83d9ab;
  (hash->outer).s[7] = 0x5be0cd19;
  (hash->outer).bytes = 0;
  lVar3 = 0;
  do {
    uVar1 = *(uint *)((long)&uStack_50 + lVar3);
    uVar2 = *(uint *)((long)&uStack_50 + lVar3 + 4);
    *(uint *)((long)&local_58 + lVar3) = *(uint *)((long)&local_58 + lVar3) ^ 0x5c5c5c5c;
    *(uint *)((long)&local_58 + lVar3 + 4) = *(uint *)((long)&local_58 + lVar3 + 4) ^ 0x5c5c5c5c;
    *(uint *)((long)&uStack_50 + lVar3) = uVar1 ^ 0x5c5c5c5c;
    *(uint *)((long)&uStack_50 + lVar3 + 4) = uVar2 ^ 0x5c5c5c5c;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  secp256k1_sha256_write(&hash->outer,(uchar *)&local_58,0x40);
  (hash->inner).s[0] = 0x6a09e667;
  (hash->inner).s[1] = 0xbb67ae85;
  (hash->inner).s[2] = 0x3c6ef372;
  (hash->inner).s[3] = 0xa54ff53a;
  (hash->inner).s[4] = 0x510e527f;
  (hash->inner).s[5] = 0x9b05688c;
  (hash->inner).s[6] = 0x1f83d9ab;
  (hash->inner).s[7] = 0x5be0cd19;
  (hash->inner).bytes = 0;
  lVar3 = 0;
  do {
    uVar1 = *(uint *)((long)&uStack_50 + lVar3);
    uVar2 = *(uint *)((long)&uStack_50 + lVar3 + 4);
    *(uint *)((long)&local_58 + lVar3) = *(uint *)((long)&local_58 + lVar3) ^ 0x6a6a6a6a;
    *(uint *)((long)&local_58 + lVar3 + 4) = *(uint *)((long)&local_58 + lVar3 + 4) ^ 0x6a6a6a6a;
    *(uint *)((long)&uStack_50 + lVar3) = uVar1 ^ 0x6a6a6a6a;
    *(uint *)((long)&uStack_50 + lVar3 + 4) = uVar2 ^ 0x6a6a6a6a;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  secp256k1_sha256_write(&hash->inner,(uchar *)&local_58,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash, const unsigned char *key, size_t keylen) {
    size_t n;
    unsigned char rkey[64];
    if (keylen <= sizeof(rkey)) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, sizeof(rkey) - keylen);
    } else {
        secp256k1_sha256 sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, sizeof(rkey));

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, sizeof(rkey));
    secp256k1_memclear(rkey, sizeof(rkey));
}